

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__stream_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  byte *pbVar1;
  uv__queue **ppuVar2;
  uint uVar3;
  uv__queue *puVar4;
  long lVar5;
  int *piVar6;
  uint *puVar7;
  cmsghdr *__cmsg;
  uint uVar8;
  int iVar9;
  undefined8 unaff_RBX;
  long lVar10;
  uint uVar11;
  uint *puVar12;
  ulong uVar13;
  long lVar14;
  uv_stream_t *stream;
  bool bVar15;
  undefined8 uStack_1c0;
  uv_buf_t local_1b8;
  uint local_1a4;
  uint local_1a0;
  int local_19c;
  uv_stream_t *local_198;
  cmsghdr *local_190;
  uint *local_188;
  size_t local_180;
  ulong local_178;
  msghdr msg;
  int error;
  undefined4 uStack_134;
  size_t sStack_130;
  
  uVar11 = *(uint *)&w[-2].watcher_queue.next;
  if ((0xe < uVar11) || ((0x5080U >> (uVar11 & 0x1f) & 1) == 0)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                  ,0x4a7,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  uVar3 = *(uint *)&w[-1].pending_queue.next;
  if ((uVar3 & 1) != 0) {
    __assert_fail("!(stream->flags & UV_HANDLE_CLOSING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                  ,0x4a8,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  stream = (uv_stream_t *)&w[-2].pending_queue;
  lVar5 = *(long *)&w[-1].pevents;
  if (lVar5 != 0) {
    msg.msg_name = (void *)CONCAT44(msg.msg_name._4_4_,4);
    if ((uVar11 != 7) && (uVar11 != 0xc)) {
      __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                    ,0x4de,"void uv__stream_connect(uv_stream_t *)");
    }
    uVar11 = w[1].pevents;
    if (uVar11 == 0) {
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                      ,0x4ea,"void uv__stream_connect(uv_stream_t *)");
      }
      getsockopt(w->fd,1,4,&error,(socklen_t *)&msg);
      uVar11 = -error;
      _error = (char *)CONCAT44(uStack_134,uVar11);
    }
    else {
      _error = (char *)CONCAT44(uStack_134,uVar11);
      w[1].pevents = 0;
    }
    if (uVar11 == 0xffffff8d) {
      return;
    }
    w[-1].pevents = 0;
    w[-1].events = 0;
    puVar4 = w[-2].pending_queue.prev;
    iVar9 = *(int *)&puVar4[2].next;
    if (iVar9 == 0) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                    ,0x4f7,"void uv__stream_connect(uv_stream_t *)");
    }
    *(int *)&puVar4[2].next = iVar9 + -1;
    if (((int)uVar11 < 0) || ((uv__io_t *)w[1].cb == w + 1)) {
      uv__io_stop((uv_loop_t *)w[-2].pending_queue.prev,w,4);
      uVar11 = error;
    }
    if (*(code **)(lVar5 + 0x48) != (code *)0x0) {
      (**(code **)(lVar5 + 0x48))(lVar5);
      uVar11 = error;
    }
    if (w->fd == -1) {
      return;
    }
    if (-1 < (int)uVar11) {
      return;
    }
    uv__stream_flush_write_queue(stream,-0x7d);
    uv__write_callbacks(stream);
    return;
  }
  iVar9 = w->fd;
  if (iVar9 < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                  ,0x4af,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((events & 0x19) != 0) {
    *(uint *)&w[-1].pending_queue.next = uVar3 & 0xfffffbfe;
    if (uVar11 == 7) {
      uVar13 = CONCAT71((int7)((ulong)unaff_RBX >> 8),*(int *)&w[2].cb != 0);
    }
    else {
      uVar13 = 0;
    }
    local_188 = &w[1].events;
    local_1a0 = (uint)uVar13;
    iVar9 = 0x20;
    do {
      if (((w[-1].watcher_queue.prev == (uv__queue *)0x0) ||
          (((ulong)w[-1].pending_queue.next & 0x1000) == 0)) || (iVar9 == 0)) goto LAB_0011d278;
      if (w[-1].watcher_queue.next == (uv__queue *)0x0) {
        __assert_fail("stream->alloc_cb != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                      ,0x414,"void uv__read(uv_stream_t *)");
      }
      local_1b8 = uv_buf_init((char *)0x0,0);
      (*(code *)w[-1].watcher_queue.next)(stream,0x10000,&local_1b8);
      if ((local_1b8.base == (char *)0x0) || (local_1b8.len == 0)) {
        uStack_1c0 = 0xffffffffffffff97;
        goto LAB_0011d274;
      }
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                      ,0x41f,"void uv__read(uv_stream_t *)");
      }
      local_19c = iVar9 + -1;
      if ((char)uVar13 == '\0') {
        while( true ) {
          lVar5 = read(w->fd,local_1b8.base,local_1b8.len);
          if (-1 < lVar5) break;
          piVar6 = __errno_location();
          iVar9 = *piVar6;
          if (iVar9 != 4) goto LAB_0011d1ce;
        }
      }
      else {
        msg.msg_flags = 0;
        msg.msg_iovlen = 1;
        msg.msg_name = (void *)0x0;
        msg.msg_namelen = 0;
        msg.msg_controllen = 0x100;
        msg.msg_control = &error;
        msg.msg_iov = (iovec *)&local_1b8;
        while (lVar5 = uv__recvmsg(w->fd,&msg,0), lVar5 < 0) {
          piVar6 = __errno_location();
          iVar9 = *piVar6;
          if (iVar9 != 4) goto LAB_0011d1ce;
        }
      }
      if (lVar5 == 0) {
        uv__stream_eof(stream,&local_1b8);
        goto LAB_0011d278;
      }
      local_180 = local_1b8.len;
      if ((char)local_1a0 != '\0') {
        __cmsg = (cmsghdr *)msg.msg_control;
        local_1a4 = events;
        local_198 = stream;
        if (msg.msg_controllen < 0x10) {
          __cmsg = (cmsghdr *)0x0;
        }
        for (; stream = local_198, events = local_1a4, __cmsg != (cmsghdr *)0x0;
            __cmsg = __cmsg_nxthdr((msghdr *)&msg,__cmsg)) {
          local_190 = __cmsg;
          if (__cmsg->cmsg_type == 1) {
            uVar13 = __cmsg->cmsg_len;
            if (uVar13 < 0x10) {
              __assert_fail("cmsg->cmsg_len >= CMSG_LEN(0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                            ,0x3e2,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
            }
            if ((uVar13 & 3) != 0) {
              __assert_fail("count % sizeof(fd) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                            ,0x3e4,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
            }
            uVar13 = uVar13 - 0x10 >> 2;
            puVar7 = local_188;
            local_178 = uVar13;
            for (lVar10 = 0; lVar14 = uVar13 - lVar10, lVar14 != 0; lVar10 = lVar10 + 1) {
              uVar11 = *(uint *)((long)&__cmsg[1].cmsg_len + lVar10 * 4);
              puVar12 = puVar7;
              if (*puVar7 != 0xffffffff) {
                puVar7 = *(uint **)&w[1].fd;
                if (puVar7 == (uint *)0x0) {
                  puVar7 = (uint *)uv__malloc(0x28);
                  events = local_1a4;
                  if (puVar7 == (uint *)0x0) goto LAB_0011d257;
                  puVar7[0] = 8;
                  puVar7[1] = 0;
LAB_0011d12a:
                  *(uint **)&w[1].fd = puVar7;
                  uVar8 = puVar7[1];
                  puVar12 = local_188;
                  uVar13 = local_178;
                  __cmsg = local_190;
                }
                else {
                  uVar3 = *puVar7;
                  uVar8 = puVar7[1];
                  if (uVar3 == uVar8) {
                    puVar7 = (uint *)uv__realloc(puVar7,(ulong)(uVar3 + 7) * 4 + 0xc);
                    events = local_1a4;
                    if (puVar7 != (uint *)0x0) {
                      *puVar7 = uVar3 + 8;
                      goto LAB_0011d12a;
                    }
                    goto LAB_0011d257;
                  }
                }
                puVar7[1] = uVar8 + 1;
                puVar7 = puVar7 + (ulong)uVar8 + 2;
              }
              *puVar7 = uVar11;
              puVar7 = puVar12;
            }
          }
          else {
            fprintf(_stderr,"ignoring non-SCM_RIGHTS ancillary data: %d\n");
            __cmsg = local_190;
          }
        }
      }
      (*(code *)w[-1].watcher_queue.prev)(stream,lVar5,&local_1b8);
      uVar13 = (ulong)local_1a0;
      iVar9 = local_19c;
    } while ((long)local_180 <= lVar5);
    pbVar1 = (byte *)((long)&w[-1].pending_queue.next + 1);
    *pbVar1 = *pbVar1 | 4;
    goto LAB_0011d278;
  }
  goto LAB_0011d281;
LAB_0011d1ce:
  uVar11 = *(uint *)&w[-1].pending_queue.next;
  if (iVar9 == 0xb) {
    if ((uVar11 >> 0xc & 1) != 0) {
      uv__io_start((uv_loop_t *)w[-2].pending_queue.prev,w,1);
    }
    uStack_1c0 = 0;
    goto LAB_0011d274;
  }
  *(uint *)&w[-1].pending_queue.next = uVar11 & 0xffff3fff;
  (*(code *)w[-1].watcher_queue.prev)(stream,-(long)*piVar6,&local_1b8);
  uVar11 = *(uint *)&w[-1].pending_queue.next;
  if ((uVar11 >> 0xc & 1) != 0) {
    *(uint *)&w[-1].pending_queue.next = uVar11 & 0xffffefff;
    uv__io_stop((uv_loop_t *)w[-2].pending_queue.prev,w,1);
    uVar11 = *(uint *)&w[-1].pending_queue.next;
    if (((uVar11 & 4) != 0) &&
       (*(uint *)&w[-1].pending_queue.next = uVar11 & 0xfffffffb, (uVar11 & 8) != 0)) {
      ppuVar2 = &(w[-2].pending_queue.prev)->prev;
      *(int *)ppuVar2 = *(int *)ppuVar2 + -1;
    }
  }
  goto LAB_0011d278;
LAB_0011d257:
  while (bVar15 = lVar14 != 0, lVar14 = lVar14 + -1, bVar15) {
    uv__close(uVar11);
  }
  uStack_1c0 = 0xfffffffffffffff4;
  stream = local_198;
LAB_0011d274:
  (*(code *)w[-1].watcher_queue.prev)(stream,uStack_1c0,&local_1b8);
LAB_0011d278:
  iVar9 = w->fd;
  if (iVar9 != -1) {
LAB_0011d281:
    if (((events & 0x10) != 0) && (((ulong)w[-1].pending_queue.next & 0x1c00) == 0x1400)) {
      _error = (char *)0x0;
      sStack_130 = 0;
      uv__stream_eof(stream,(uv_buf_t *)&error);
      iVar9 = w->fd;
    }
    if (((events & 0x1c) != 0) && (iVar9 != -1)) {
      uv__write(stream);
      uv__write_callbacks(stream);
      if ((uv__io_t *)w[1].cb == w + 1) {
        uv__drain(stream);
      }
    }
  }
  return;
}

Assistant:

static void uv__stream_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;

  stream = container_of(w, uv_stream_t, io_watcher);

  assert(stream->type == UV_TCP ||
         stream->type == UV_NAMED_PIPE ||
         stream->type == UV_TTY);
  assert(!(stream->flags & UV_HANDLE_CLOSING));

  if (stream->connect_req) {
    uv__stream_connect(stream);
    return;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Ignore POLLHUP here. Even if it's set, there may still be data to read. */
  if (events & (POLLIN | POLLERR | POLLHUP))
    uv__read(stream);

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  /* Short-circuit iff POLLHUP is set, the user is still interested in read
   * events and uv__read() reported a partial read but not EOF. If the EOF
   * flag is set, uv__read() called read_cb with err=UV_EOF and we don't
   * have to do anything. If the partial read flag is not set, we can't
   * report the EOF yet because there is still data to read.
   */
  if ((events & POLLHUP) &&
      (stream->flags & UV_HANDLE_READING) &&
      (stream->flags & UV_HANDLE_READ_PARTIAL) &&
      !(stream->flags & UV_HANDLE_READ_EOF)) {
    uv_buf_t buf = { NULL, 0 };
    uv__stream_eof(stream, &buf);
  }

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  if (events & (POLLOUT | POLLERR | POLLHUP)) {
    uv__write(stream);
    uv__write_callbacks(stream);

    /* Write queue drained. */
    if (uv__queue_empty(&stream->write_queue))
      uv__drain(stream);
  }
}